

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

JavascriptString * __thiscall Js::JavascriptFunction::GetDisplayName(JavascriptFunction *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  JavascriptFunction *local_40;
  JavascriptString *sourceStringName;
  ParseableFunctionInfo *func;
  JavascriptLibrary *library;
  FunctionProxy *proxy;
  ScriptContext *scriptContext;
  JavascriptFunction *this_local;
  
  scriptContext = (ScriptContext *)this;
  proxy = (FunctionProxy *)RecyclableObject::GetScriptContext((RecyclableObject *)this);
  library = (JavascriptLibrary *)GetFunctionProxy(this);
  func = (ParseableFunctionInfo *)ScriptContext::GetLibrary((ScriptContext *)proxy);
  if (library == (JavascriptLibrary *)0x0) {
    local_40 = (JavascriptFunction *)0x0;
    bVar1 = GetSourceStringName(this,(JavascriptString **)&local_40);
    if (bVar1) {
      this_local = local_40;
    }
    else {
      this_local = (JavascriptFunction *)
                   JavascriptLibrary::GetFunctionDisplayString((JavascriptLibrary *)func);
    }
  }
  else {
    sourceStringName =
         (JavascriptString *)FunctionProxy::EnsureDeserialized((FunctionProxy *)library);
    bVar1 = FunctionProxy::GetDisplayNameIsRecyclerAllocated((FunctionProxy *)sourceStringName);
    if (bVar1) {
      iVar2 = (*(sourceStringName->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
      this_local = (JavascriptFunction *)
                   JavascriptString::NewWithSz
                             ((char16 *)CONCAT44(extraout_var,iVar2),(ScriptContext *)proxy);
    }
    else {
      iVar2 = (*(sourceStringName->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
      this_local = (JavascriptFunction *)
                   JavascriptString::NewCopySz
                             ((char16 *)CONCAT44(extraout_var_00,iVar2),(ScriptContext *)proxy);
    }
  }
  return (JavascriptString *)this_local;
}

Assistant:

JavascriptString* JavascriptFunction::GetDisplayName() const
    {
        ScriptContext* scriptContext = this->GetScriptContext();
        FunctionProxy* proxy = this->GetFunctionProxy();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        if (proxy)
        {
            ParseableFunctionInfo * func = proxy->EnsureDeserialized();
            if (func->GetDisplayNameIsRecyclerAllocated())
            {
                return JavascriptString::NewWithSz(func->GetDisplayName(), scriptContext);
            }
            else
            {
                return JavascriptString::NewCopySz(func->GetDisplayName(), scriptContext);
            }
        }
        JavascriptString* sourceStringName = nullptr;
        if (GetSourceStringName(&sourceStringName))
        {
            return sourceStringName;
        }

        return library->GetFunctionDisplayString();
    }